

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O0

bool __thiscall
TasGrid::GridWavelet::addParent(GridWavelet *this,int *point,int direction,Data2D<int> *destination)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  int local_5c;
  bool local_55;
  int c;
  bool added;
  allocator<int> local_41;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> dad;
  Data2D<int> *destination_local;
  int direction_local;
  int *point_local;
  GridWavelet *this_local;
  
  iVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
  dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)destination;
  ::std::allocator<int>::allocator(&local_41);
  ::std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)local_40,point,point + iVar2,&local_41);
  ::std::allocator<int>::~allocator(&local_41);
  local_55 = false;
  iVar2 = RuleWavelet::getParent(&this->rule1D,point[direction]);
  pvVar3 = ::std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,(long)direction);
  *pvVar3 = iVar2;
  pvVar3 = ::std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,(long)direction);
  if (*pvVar3 == -2) {
    for (local_5c = 0; iVar2 = RuleWavelet::getNumPoints(&this->rule1D,0), local_5c < iVar2;
        local_5c = local_5c + 1) {
      pvVar3 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_40,(long)direction);
      *pvVar3 = local_5c;
      bVar1 = MultiIndexSet::missing
                        (&(this->super_BaseCanonicalGrid).points,
                         (vector<int,_std::allocator<int>_> *)local_40);
      if (bVar1) {
        Data2D<int>::appendStrip
                  ((Data2D<int> *)
                   dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                   ._M_end_of_storage,(vector<int,_std::allocator<int>_> *)local_40);
        local_55 = true;
      }
    }
  }
  else {
    pvVar3 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_40,(long)direction);
    if ((-1 < *pvVar3) &&
       (local_55 = MultiIndexSet::missing
                             (&(this->super_BaseCanonicalGrid).points,
                              (vector<int,_std::allocator<int>_> *)local_40), local_55)) {
      Data2D<int>::appendStrip
                ((Data2D<int> *)
                 dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage,(vector<int,_std::allocator<int>_> *)local_40);
    }
  }
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  return local_55;
}

Assistant:

bool GridWavelet::addParent(const int point[], int direction, Data2D<int> &destination) const{
    std::vector<int> dad(point, point + num_dimensions);
    bool added = false;
    dad[direction] = rule1D.getParent(point[direction]);
    if (dad[direction] == -2){
        for(int c=0; c<rule1D.getNumPoints(0); c++){
            dad[direction] = c;
            if (points.missing(dad)){
                destination.appendStrip(dad);
                added = true;
            }
        }
    }else if (dad[direction] >= 0){
        if (points.missing(dad)){
            destination.appendStrip(dad);
            added = true;
        }
    }
    return added;
}